

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

Index __thiscall
SimulationDecPOMDPDiscrete::GetAction
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
          *agents,Index i,Index jaI,Index joI,double r,Index prevJoI,Index sI,Index prevJaI,
          double *specialR)

{
  const_reference ppAVar1;
  reference pvVar2;
  uint in_EDX;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
  *in_RSI;
  int in_R8D;
  uint in_R9D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff88;
  value_type pAVar3;
  undefined4 in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint local_34;
  uint local_1c;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
  *local_18;
  Index local_4;
  
  local_34 = in_R9D;
  if (in_R8D == 0x7fffffff) {
    ppAVar1 = std::
              vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
              ::operator[](in_RSI,(ulong)in_EDX);
    local_4 = (*((*ppAVar1)->super_AgentDecPOMDPDiscrete).super_SimulationAgent.
                _vptr_SimulationAgent[8])(*ppAVar1,0x7fffffff,(ulong)local_34);
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    PlanningUnitMADPDiscrete::JointToIndividualObservationIndices
              (in_stack_ffffffffffffff88,(Index)((ulong)&local_50 >> 0x20));
    ppAVar1 = std::
              vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
              ::operator[](local_18,(ulong)local_1c);
    pAVar3 = *ppAVar1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_50,(ulong)local_1c);
    local_4 = (*(pAVar3->super_AgentDecPOMDPDiscrete).super_SimulationAgent._vptr_SimulationAgent[8]
              )(pAVar3,(ulong)*pvVar2,(ulong)local_34);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(local_4,in_stack_ffffffffffffff90));
  }
  return local_4;
}

Assistant:

Index SimulationDecPOMDPDiscrete::
GetAction(const vector<AgentDelayedSharedObservations*> &agents,
          Index i, Index jaI, Index joI, double r, Index prevJoI,
          Index sI, Index prevJaI, double &specialR) const
{
    if(joI==INT_MAX) //first stage: there is no joI
        return(agents[i]->Act(INT_MAX,prevJoI));
    else
    {
        vector<Index> oIs=_m_pu->JointToIndividualObservationIndices(joI);
        return(agents[i]->Act(oIs[i],prevJoI));
    }
}